

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O0

size_t adios2::core::engine::ssc::TotalDataSize(Dims *dims,size_t elementSize,ShapeID *shapeId)

{
  int *in_RDX;
  unsigned_long in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffef8;
  allocator *paVar1;
  allocator local_e1;
  string local_e0 [36];
  int in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [40];
  unsigned_long *local_30;
  unsigned_long *local_28;
  unsigned_long local_18;
  unsigned_long local_8;
  
  if ((*in_RDX == 2) || (*in_RDX == 5)) {
    local_18 = in_RSI;
    local_28 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (in_stack_fffffffffffffef8);
    local_30 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_fffffffffffffef8);
    local_8 = std::
              accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,std::multiplies<unsigned_long>>
                        (local_28,local_30,local_18);
  }
  else {
    local_8 = in_RSI;
    if ((*in_RDX != 1) && (*in_RDX != 4)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Engine",&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"SscHelper",&local_91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff48,"TotalDataSize",
                 (allocator *)&stack0xffffffffffffff47);
      paVar1 = &local_e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"ShapeID not supported",paVar1);
      helper::Throw<std::runtime_error>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t TotalDataSize(const Dims &dims, const size_t elementSize, const ShapeID &shapeId)
{
    if (shapeId == ShapeID::GlobalArray || shapeId == ShapeID::LocalArray)
    {
        return std::accumulate(dims.begin(), dims.end(), elementSize, std::multiplies<size_t>());
    }
    else if (shapeId == ShapeID::GlobalValue || shapeId == ShapeID::LocalValue)
    {
        return elementSize;
    }
    helper::Throw<std::runtime_error>("Engine", "SscHelper", "TotalDataSize",
                                      "ShapeID not supported");
    return 0;
}